

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlabel.cpp
# Opt level: O1

void QLabel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPixmap open;
  long *plVar1;
  uint *puVar2;
  int *piVar3;
  long lVar4;
  QArrayData *pQVar5;
  QWidgetData *pQVar6;
  long lVar7;
  QPixmap *pixmap;
  undefined8 uVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  QLabelPrivate *pQVar13;
  long in_FS_OFFSET;
  undefined1 local_70 [24];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_58.d.ptr = (char16_t *)_a[1];
    iVar12 = 0;
    goto LAB_0041a5e0;
  case 1:
    local_58.d.ptr = (char16_t *)_a[1];
    iVar12 = 1;
LAB_0041a5e0:
    local_58.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar12,(void **)&local_58);
    break;
  case 2:
    setText((QLabel *)_o,(QString *)_a[1]);
    break;
  case 3:
    setPixmap((QLabel *)_o,(QPixmap *)_a[1]);
    break;
  case 4:
    setPicture((QLabel *)_o,(QPicture *)_a[1]);
    break;
  case 5:
    setMovie((QLabel *)_o,*_a[1]);
    break;
  case 6:
    setNum((QLabel *)_o,*_a[1]);
    break;
  case 7:
    setNum((QLabel *)_o,*_a[1]);
    break;
  case 8:
    pQVar13 = *(QLabelPrivate **)(_o + 8);
    QLabelPrivate::clearContents(pQVar13);
    QLabelPrivate::updateLabel(pQVar13);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0041a526_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == linkActivated) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_0041a526_caseD_3;
      }
      if (((code *)*plVar1 == linkHovered) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_0041a526_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_0041a526_caseD_3;
        goto switchD_0041a526_caseD_1;
      }
    }
    goto switchD_0041a526_caseD_2;
  }
switchD_0041a526_caseD_1:
  if (0xb < (uint)_id) goto LAB_0041a869;
  puVar2 = (uint *)*_a;
  switch(_id) {
  case 0:
    lVar7 = *(long *)(_o + 8);
    piVar3 = *(int **)(lVar7 + 0x288);
    lVar4 = *(long *)(lVar7 + 0x290);
    lVar7 = *(long *)(lVar7 + 0x298);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    pQVar5 = *(QArrayData **)puVar2;
    *(int **)puVar2 = piVar3;
    *(long *)(puVar2 + 2) = lVar4;
    *(long *)(puVar2 + 4) = lVar7;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar12 = (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x0041a743:
      if (iVar12 == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    break;
  case 1:
    uVar11 = *(uint *)(*(long *)(_o + 8) + 0x324);
    goto LAB_0041a849;
  case 2:
    QLabel::pixmap((QLabel *)local_70);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    uVar8 = local_70._16_8_;
    local_58.d.d = (Data *)QDataStream::operator<<;
    local_70._16_8_ = 0;
    local_58.d.size = *(qsizetype *)(puVar2 + 4);
    *(undefined8 *)(puVar2 + 4) = uVar8;
    QPixmap::~QPixmap((QPixmap *)&local_58);
    QPixmap::~QPixmap((QPixmap *)local_70);
    break;
  case 3:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 0x340) >> 1;
    goto LAB_0041a863;
  case 4:
    *puVar2 = *(uint *)(*(long *)(_o + 8) + 0x338) & 0x1ff;
    break;
  case 5:
    *(byte *)puVar2 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x338) >> 0xc) & 1;
    break;
  case 6:
    uVar11 = *(uint *)(*(long *)(_o + 8) + 0x334);
    goto LAB_0041a849;
  case 7:
    uVar11 = *(uint *)(*(long *)(_o + 8) + 0x33c);
    goto LAB_0041a849;
  case 8:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 0x341);
LAB_0041a863:
    bVar10 = (bool)(bVar9 & 1);
LAB_0041a865:
    *(bool *)puVar2 = bVar10;
    break;
  case 9:
    uVar11 = *(uint *)(*(long *)(_o + 8) + 0x32c);
LAB_0041a849:
    *puVar2 = uVar11;
    break;
  case 10:
    bVar10 = hasSelectedText((QLabel *)_o);
    goto LAB_0041a865;
  case 0xb:
    selectedText(&local_58,(QLabel *)_o);
    pQVar5 = *(QArrayData **)puVar2;
    *(Data **)puVar2 = local_58.d.d;
    pQVar6 = *(QWidgetData **)(puVar2 + 2);
    *(char16_t **)(puVar2 + 2) = local_58.d.ptr;
    lVar7 = *(long *)(puVar2 + 4);
    *(qsizetype *)(puVar2 + 4) = local_58.d.size;
    local_58.d.d = (Data *)pQVar5;
    local_58.d.ptr = (char16_t *)pQVar6;
    local_58.d.size = lVar7;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar12 = (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x0041a743;
    }
  }
LAB_0041a869:
  if (_c != WriteProperty) goto switchD_0041a526_caseD_3;
switchD_0041a526_caseD_2:
  if (9 < (uint)_id) goto switchD_0041a526_caseD_3;
  pixmap = (QPixmap *)*_a;
  switch(_id) {
  case 0:
    setText((QLabel *)_o,(QString *)pixmap);
    break;
  case 1:
    setTextFormat((QLabel *)_o,*(TextFormat *)pixmap);
    break;
  case 2:
    setPixmap((QLabel *)_o,pixmap);
    break;
  case 3:
    setScaledContents((QLabel *)_o,(bool)*pixmap);
    break;
  case 4:
    pQVar13 = *(QLabelPrivate **)(_o + 8);
    if ((pQVar13->align & 0x1ffU) == *(uint *)pixmap) break;
    pQVar13->align = *(uint *)pixmap & 0x1ff | pQVar13->align & 0xfffffe00U;
    goto LAB_0041a940;
  case 5:
    pQVar13 = *(QLabelPrivate **)(_o + 8);
    pQVar13->align = (uint)(byte)*pixmap << 0xc | pQVar13->align & 0xffffefffU;
    goto LAB_0041a940;
  case 6:
    pQVar13 = *(QLabelPrivate **)(_o + 8);
    if (pQVar13->margin == *(int *)pixmap) break;
    pQVar13->margin = *(int *)pixmap;
    goto LAB_0041a940;
  case 7:
    pQVar13 = *(QLabelPrivate **)(_o + 8);
    pQVar13->indent = *(int *)pixmap;
LAB_0041a940:
    QLabelPrivate::updateLabel(pQVar13);
    break;
  case 8:
    open = *pixmap;
    lVar7 = *(long *)(_o + 8);
    *(ushort *)(lVar7 + 0x340) =
         (ushort)*(undefined4 *)(lVar7 + 0x340) & 0xfeff | (ushort)(byte)open << 8;
    if (*(QWidgetTextControl **)(lVar7 + 0x2f8) != (QWidgetTextControl *)0x0) {
      QWidgetTextControl::setOpenExternalLinks(*(QWidgetTextControl **)(lVar7 + 0x2f8),(bool)open);
    }
    break;
  case 9:
    setTextInteractionFlags
              ((QLabel *)_o,
               (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
               *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)pixmap);
  }
switchD_0041a526_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLabel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->setPixmap((*reinterpret_cast< std::add_pointer_t<QPixmap>>(_a[1]))); break;
        case 4: _t->setPicture((*reinterpret_cast< std::add_pointer_t<QPicture>>(_a[1]))); break;
        case 5: _t->setMovie((*reinterpret_cast< std::add_pointer_t<QMovie*>>(_a[1]))); break;
        case 6: _t->setNum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setNum((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 8: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkActivated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkHovered, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->pixmap(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasScaledContents(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->margin(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->indent(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 9: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 2: _t->setPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setScaledContents(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMargin(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setIndent(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        default: break;
        }
    }
}